

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_or_null_simplification.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::TryRewriteEqualOrIsNull(duckdb *this,Expression *equal_expr,Expression *and_expr)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  BoundComparisonExpression *pBVar4;
  BoundConjunctionExpression *pBVar5;
  type pEVar6;
  BoundOperatorExpression *pBVar7;
  reference this_00;
  undefined4 extraout_var;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *item;
  pointer this_01;
  byte bVar8;
  bool bVar9;
  ExpressionType local_61;
  undefined8 local_60;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_58;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_50;
  type local_48;
  type local_40;
  undefined8 local_38;
  
  if (((equal_expr->super_BaseExpression).type == COMPARE_BOUNDARY_START) &&
     ((and_expr->super_BaseExpression).type == CONJUNCTION_AND)) {
    pBVar4 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&equal_expr->super_BaseExpression);
    pBVar5 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                       (&and_expr->super_BaseExpression);
    if ((long)(pBVar5->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(pBVar5->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      local_58 = &pBVar4->left;
      local_40 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(local_58);
      local_50 = &pBVar4->right;
      local_48 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(local_50);
      this_01 = (pBVar5->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (pBVar5->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar9 = this_01 == puVar1;
      if (bVar9) {
        bVar8 = 1;
      }
      else {
        bVar8 = 0;
        local_60 = 0;
        do {
          pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(this_01);
          if ((pEVar6->super_BaseExpression).type == OPERATOR_IS_NULL) {
            pBVar7 = BaseExpression::Cast<duckdb::BoundOperatorExpression>
                               (&pEVar6->super_BaseExpression);
            this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      ::operator[](&pBVar7->children,0);
            pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator*(this_00);
            iVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[10])(pEVar6);
            bVar2 = true;
            if ((char)iVar3 == '\0') {
              iVar3 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[10])(pEVar6);
              bVar2 = true;
              if ((char)iVar3 == '\0') goto LAB_00685545;
              local_60 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
            }
            else {
              bVar8 = 1;
            }
          }
          else {
LAB_00685545:
            *(undefined8 *)this = 0;
            bVar2 = false;
          }
          if (!bVar2) break;
          this_01 = this_01 + 1;
          bVar9 = this_01 == puVar1;
        } while (!bVar9);
        bVar8 = bVar8 & (byte)local_60 ^ 1;
      }
      if (!bVar9) {
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
      }
      if (bVar8 == 0) {
        local_61 = COMPARE_BOUNDARY_END;
        make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((duckdb *)&local_38,&local_61,local_58,local_50);
        *(undefined8 *)this = local_38;
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
      }
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

static unique_ptr<Expression> TryRewriteEqualOrIsNull(Expression &equal_expr, Expression &and_expr) {
	if (equal_expr.GetExpressionType() != ExpressionType::COMPARE_EQUAL ||
	    and_expr.GetExpressionType() != ExpressionType::CONJUNCTION_AND) {
		return nullptr;
	}

	auto &equal_cast = equal_expr.Cast<BoundComparisonExpression>();
	auto &and_cast = and_expr.Cast<BoundConjunctionExpression>();

	if (and_cast.children.size() != 2) {
		return nullptr;
	}

	// Make sure on the AND conjunction the relevant conditions appear
	auto &a_exp = *equal_cast.left;
	auto &b_exp = *equal_cast.right;
	bool a_is_null_found = false;
	bool b_is_null_found = false;

	for (const auto &item : and_cast.children) {
		auto &next_exp = *item;

		if (next_exp.GetExpressionType() == ExpressionType::OPERATOR_IS_NULL) {
			auto &next_exp_cast = next_exp.Cast<BoundOperatorExpression>();
			auto &child = *next_exp_cast.children[0];

			// Test for equality on both 'a' and 'b' expressions
			if (Expression::Equals(child, a_exp)) {
				a_is_null_found = true;
			} else if (Expression::Equals(child, b_exp)) {
				b_is_null_found = true;
			} else {
				return nullptr;
			}
		} else {
			return nullptr;
		}
	}
	if (a_is_null_found && b_is_null_found) {
		return make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_NOT_DISTINCT_FROM,
		                                            std::move(equal_cast.left), std::move(equal_cast.right));
	}
	return nullptr;
}